

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O2

string * __thiscall
soul::Program::ProgramImpl::getFunctionNameWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,Module *context,Function *f)

{
  Module *in_RAX;
  Module *pMVar1;
  string *psVar2;
  pool_ptr<soul::Module> m;
  pool_ptr<soul::Module> local_28;
  
  local_28.object = in_RAX;
  findModuleContainingFunction((ProgramImpl *)&stack0xffffffffffffffd8,(Function *)this);
  if (local_28.object != (Module *)0x0) {
    if (local_28.object == context) {
      psVar2 = Identifier::toString_abi_cxx11_(&f->name);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    }
    else {
      pMVar1 = pool_ptr<soul::Module>::operator->(&stack0xffffffffffffffd8);
      psVar2 = Identifier::operator_cast_to_string_(&f->name);
      TokenisedPathString::join(__return_storage_ptr__,&pMVar1->fullName,psVar2);
    }
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("getFunctionNameWithQualificationIfNeeded",0xd4);
}

Assistant:

std::string getFunctionNameWithQualificationIfNeeded (const Module& context, const heart::Function& f) const
    {
        if (auto m = findModuleContainingFunction (f))
        {
            if (m == std::addressof (context))
                return f.name.toString();

            return TokenisedPathString::join (m->fullName, f.name);
        }

        SOUL_ASSERT_FALSE;
        return f.name;
    }